

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamRecognitionException.hpp
# Opt level: O2

void __thiscall
antlr::TokenStreamRecognitionException::~TokenStreamRecognitionException
          (TokenStreamRecognitionException *this)

{
  (this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__TokenStreamRecognitionException_002bc020;
  RecognitionException::~RecognitionException(&this->recog);
  ANTLRException::~ANTLRException((ANTLRException *)this);
  return;
}

Assistant:

virtual ~TokenStreamRecognitionException() throw()
	{
	}